

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_array_container_lazy_xor
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  undefined4 *puVar1;
  int size;
  array_container_t *paVar2;
  bitset_container_t *pbVar3;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  container_t **dst_local;
  array_container_t *src_2_local;
  array_container_t *src_1_local;
  
  size = src_1->cardinality + src_2->cardinality;
  if (size < 0x401) {
    paVar2 = array_container_create_given_capacity(size);
    *dst = paVar2;
    if (*dst != (container_t *)0x0) {
      array_container_xor(src_1,src_2,(array_container_t *)*dst);
    }
    src_1_local._7_1_ = false;
  }
  else {
    pbVar3 = bitset_container_from_array(src_1);
    *dst = pbVar3;
    if (*dst != (container_t *)0x0) {
      puVar1 = (undefined4 *)*dst;
      bitset_flip_list(*(uint64_t **)(puVar1 + 2),src_2->array,(long)src_2->cardinality);
      *puVar1 = 0xffffffff;
    }
    src_1_local._7_1_ = true;
  }
  return src_1_local._7_1_;
}

Assistant:

bool array_array_container_lazy_xor(
    const array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    // upper bound, but probably poor estimate for xor
    if (totalCardinality <= ARRAY_LAZY_LOWERBOUND) {
        *dst = array_container_create_given_capacity(totalCardinality);
        if (*dst != NULL)
            array_container_xor(src_1, src_2, CAST_array(*dst));
        return false;  // not a bitset
    }
    *dst = bitset_container_from_array(src_1);
    bool returnval = true;  // expect a bitset (maybe, for XOR??)
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_flip_list(ourbitset->words, src_2->array, src_2->cardinality);
        ourbitset->cardinality = BITSET_UNKNOWN_CARDINALITY;
    }
    return returnval;
}